

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeleton(OgreBinarySerializer *this,Skeleton *skeleton)

{
  Bone *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  DeadlyImportError *pDVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *this_01;
  Logger *pLVar7;
  size_type sVar8;
  reference ppBVar9;
  Bone *bone;
  size_t len;
  size_t i;
  undefined1 local_210 [5];
  bool firstAnim;
  bool firstBone;
  string local_98;
  undefined1 local_78 [8];
  string version;
  allocator<char> local_41;
  string local_40;
  uint16_t local_1a;
  Skeleton *pSStack_18;
  uint16_t id;
  Skeleton *skeleton_local;
  OgreBinarySerializer *this_local;
  
  pSStack_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  local_1a = ReadHeader(this,false);
  if (local_1a != 0x1000) {
    version.field_2._M_local_buf[0xb] = '\x01';
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid Ogre Skeleton file header.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_40);
    version.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  ReadLine_abi_cxx11_((string *)local_78,this);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)SKELETON_VERSION_1_8_abi_cxx11_);
  if ((bVar2) &&
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)SKELETON_VERSION_1_1_abi_cxx11_), bVar2)) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_210,(char (*) [18])"Skeleton version ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_78);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(char (*) [33])" not supported by this importer.");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(char (*) [22])" Supported versions: ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               SKELETON_VERSION_1_8_abi_cxx11_);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(char (*) [6])0xc6d08b);
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )SKELETON_VERSION_1_1_abi_cxx11_);
    Formatter::basic_formatter::operator_cast_to_string(&local_98,this_01);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_98);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"Reading Skeleton");
  bVar2 = true;
  bVar1 = true;
  while (bVar3 = AtEnd(this), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_1a = ReadHeader(this,true);
    if (local_1a == 0x1010) {
      uVar4 = Read<unsigned_short>(this);
      pSStack_18->blendMode = (uint)uVar4;
    }
    else if (local_1a == 0x2000) {
      if (bVar2) {
        pLVar7 = DefaultLogger::get();
        Logger::debug(pLVar7,"  - Bones");
        bVar2 = false;
      }
      ReadBone(this,pSStack_18);
    }
    else if (local_1a == 0x3000) {
      ReadBoneParent(this,pSStack_18);
    }
    else if (local_1a == 0x4000) {
      if (bVar1) {
        pLVar7 = DefaultLogger::get();
        Logger::debug(pLVar7,"  - Animations");
        bVar1 = false;
      }
      ReadSkeletonAnimation(this,pSStack_18);
    }
    else if (local_1a == 0x5000) {
      ReadSkeletonAnimationLink(this,pSStack_18);
    }
  }
  len = 0;
  sVar8 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                    (&pSStack_18->bones);
  for (; len < sVar8; len = len + 1) {
    ppBVar9 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::operator[]
                        (&pSStack_18->bones,len);
    this_00 = *ppBVar9;
    bVar2 = Bone::IsParented(this_00);
    if (!bVar2) {
      Bone::CalculateWorldMatrixAndDefaultPose(this_00,pSStack_18);
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeleton(Skeleton *skeleton)
{
    uint16_t id = ReadHeader(false);
    if (id != HEADER_CHUNK_ID) {
        throw DeadlyExportError("Invalid Ogre Skeleton file header.");
    }

    // This deserialization supports both versions of the skeleton spec
    std::string version = ReadLine();
    if (version != SKELETON_VERSION_1_8 && version != SKELETON_VERSION_1_1)
    {
        throw DeadlyExportError(Formatter::format() << "Skeleton version " << version << " not supported by this importer."
            << " Supported versions: " << SKELETON_VERSION_1_8 << " and " << SKELETON_VERSION_1_1);
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    bool firstBone = true;
    bool firstAnim = true;

    while (!AtEnd())
    {
        id = ReadHeader();
        switch(id)
        {
            case SKELETON_BLENDMODE:
            {
                skeleton->blendMode = static_cast<Skeleton::BlendMode>(Read<uint16_t>());
                break;
            }
            case SKELETON_BONE:
            {
                if (firstBone)
                {
                    ASSIMP_LOG_DEBUG("  - Bones");
                    firstBone = false;
                }

                ReadBone(skeleton);
                break;
            }
            case SKELETON_BONE_PARENT:
            {
                ReadBoneParent(skeleton);
                break;
            }
            case SKELETON_ANIMATION:
            {
                if (firstAnim)
                {
                    ASSIMP_LOG_DEBUG("  - Animations");
                    firstAnim = false;
                }

                ReadSkeletonAnimation(skeleton);
                break;
            }
            case SKELETON_ANIMATION_LINK:
            {
                ReadSkeletonAnimationLink(skeleton);
                break;
            }
        }
    }

    // Calculate bone matrices for root bones. Recursively calculates their children.
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *bone = skeleton->bones[i];
        if (!bone->IsParented())
            bone->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}